

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O2

void __thiscall ftxui::Renderer::Impl::~Impl(Impl *this)

{
  (this->super_ComponentBase)._vptr_ComponentBase = (_func_int **)&PTR__Impl_001685a0;
  std::_Function_base::~_Function_base(&(this->render_).super__Function_base);
  ComponentBase::~ComponentBase(&this->super_ComponentBase);
  return;
}

Assistant:

Component Renderer(std::function<Element()> render) {
  class Impl : public ComponentBase {
   public:
    Impl(std::function<Element()> render) : render_(std::move(render)) {}
    Element Render() override { return render_(); }
    std::function<Element()> render_;
  };

  return Make<Impl>(std::move(render));
}